

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

bool __thiscall
wasm::OptimizeInstructions::areConsecutiveInputsEqual
          (OptimizeInstructions *this,Expression *left,Expression *right)

{
  PassRunner *pPVar1;
  Module *pMVar2;
  long lVar3;
  size_t sVar4;
  Expression *pEVar5;
  bool bVar6;
  Expression **ppEVar7;
  Expression *right_00;
  LocalSet *this_00;
  LocalSet *left_00;
  undefined1 local_300 [8];
  EffectAnalyzer rightEffects;
  EffectAnalyzer originalRightEffects;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  pMVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
  do {
    this_00 = (LocalSet *)left;
    rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)this_00;
    ppEVar7 = Properties::getImmediateFallthroughPtr
                        ((Expression **)
                         &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count,&pPVar1->options,pMVar2,NoTeeBrIf);
    left = *ppEVar7;
  } while ((LocalSet *)*ppEVar7 != this_00);
  if (((((this_00->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression._id ==
         LocalSetId) && (right->_id == LocalGetId)) && (bVar6 = LocalSet::isTee(this_00), bVar6)) &&
     (*(Index *)(right + 1) == this_00->index)) {
    return true;
  }
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  pMVar2 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).
           super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .
           super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
           .currModule;
  originalRightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count =
       (size_t)this;
  do {
    left_00 = this_00;
    rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)left_00;
    ppEVar7 = Properties::getImmediateFallthroughPtr
                        ((Expression **)
                         &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count,&pPVar1->options,pMVar2,AllowTeeBrIf);
    this_00 = (LocalSet *)*ppEVar7;
  } while ((LocalSet *)*ppEVar7 != left_00);
  lVar3 = *(long *)(originalRightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                    _M_node_count + 8);
  pMVar2 = *(Module **)
            (originalRightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count +
            0x128);
  pEVar5 = right;
  do {
    right_00 = pEVar5;
    rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)right_00
    ;
    ppEVar7 = Properties::getImmediateFallthroughPtr
                        ((Expression **)
                         &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count,(PassOptions *)(lVar3 + 0x30),pMVar2,AllowTeeBrIf);
    pEVar5 = *ppEVar7;
  } while (*ppEVar7 != right_00);
  bVar6 = ExpressionAnalyzer::equal((Expression *)left_00,right_00);
  sVar4 = originalRightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count;
  if (bVar6) {
    if (right_00 != right) {
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)
                 &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (PassOptions *)
                 (*(long *)(originalRightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count + 8) + 0x30),
                 *(Module **)
                  (originalRightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                   _M_node_count + 0x128),right);
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)local_300,(PassOptions *)(*(long *)(sVar4 + 8) + 0x30),
                 *(Module **)(sVar4 + 0x128),right_00);
      bVar6 = EffectAnalyzer::invalidates
                        ((EffectAnalyzer *)
                         &rightEffects.delegateTargets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count,(EffectAnalyzer *)local_300);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&rightEffects.breakTargets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&rightEffects.danglingPop);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&rightEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&rightEffects.localsWritten._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&rightEffects.localsRead._M_t._M_impl.super__Rb_tree_header._M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&rightEffects.features);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&originalRightEffects.breakTargets._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&originalRightEffects.danglingPop);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&originalRightEffects.mutableGlobalsRead._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
      ::~_Rb_tree((_Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
                   *)&originalRightEffects.localsWritten._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&originalRightEffects.localsRead._M_t._M_impl.super__Rb_tree_header.
                      _M_node_count);
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree((_Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)&originalRightEffects.features);
      if (bVar6) goto LAB_009d4475;
    }
    bVar6 = Properties::isGenerative((Expression *)left_00);
    bVar6 = !bVar6;
  }
  else {
LAB_009d4475:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

bool areConsecutiveInputsEqual(Expression* left, Expression* right) {
    // When we look for a tee/get pair, we can consider the fallthrough values
    // for the first, as the fallthrough happens last (however, we must use
    // NoTeeBrIf as we do not want to look through the tee). We cannot do this
    // on the second, however, as there could be effects in the middle.
    // TODO: Use effects here perhaps.
    left =
      Properties::getFallthrough(left,
                                 getPassOptions(),
                                 *getModule(),
                                 Properties::FallthroughBehavior::NoTeeBrIf);
    if (areMatchingTeeAndGet(left, right)) {
      return true;
    }

    // Ignore extraneous things and compare them syntactically. We can also
    // look at the full fallthrough for both sides now.
    left = getFallthrough(left);
    auto* originalRight = right;
    right = getFallthrough(right);
    if (!ExpressionAnalyzer::equal(left, right)) {
      return false;
    }

    // We must also not have non-fallthrough effects that invalidate us, such as
    // this situation:
    //
    //  (local.get $x)
    //  (block
    //    (local.set $x ..)
    //    (local.get $x)
    //  )
    //
    // The fallthroughs are identical, but the set may cause us to read a
    // different value.
    if (originalRight != right) {
      // TODO: We could be more precise here and ignore right itself in
      //       originalRightEffects.
      auto originalRightEffects = effects(originalRight);
      auto rightEffects = effects(right);
      if (originalRightEffects.invalidates(rightEffects)) {
        return false;
      }
    }

    // To be equal, they must also be known to return the same result
    // deterministically.
    return !Properties::isGenerative(left);
  }